

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_ctrlpt.c
# Opt level: O0

int ScheduleGenaAutoRenew(int client_handle,int TimeOut,GenlibClientSubscription *sub)

{
  UpnpEventSubscribe *p;
  int *__s;
  UpnpString *pUVar1;
  undefined1 local_60 [8];
  ThreadPoolJob job;
  int return_code;
  job_arg_conflict *arg;
  UpnpEventSubscribe *RenewEvent;
  GenlibClientSubscription *sub_local;
  int TimeOut_local;
  int client_handle_local;
  
  job.jobId = 0;
  memset(local_60,0,0x30);
  if (TimeOut == -1) {
    job.jobId = 0;
  }
  else {
    p = UpnpEventSubscribe_new();
    if (p == (UpnpEventSubscribe *)0x0) {
      job.jobId = -0x68;
    }
    else {
      __s = (int *)malloc(0x10);
      if (__s == (int *)0x0) {
        free(p);
        job.jobId = -0x68;
      }
      else {
        memset(__s,0,0x10);
        UpnpEventSubscribe_set_ErrCode(p,0);
        UpnpEventSubscribe_set_TimeOut(p,TimeOut);
        pUVar1 = GenlibClientSubscription_get_SID(sub);
        UpnpEventSubscribe_set_SID(p,pUVar1);
        pUVar1 = GenlibClientSubscription_get_EventURL(sub);
        UpnpEventSubscribe_set_PublisherUrl(p,pUVar1);
        *__s = client_handle;
        *(UpnpEventSubscribe **)(__s + 2) = p;
        TPJobInit((ThreadPoolJob *)local_60,GenaAutoRenewSubscription,__s);
        TPJobSetFreeFunction((ThreadPoolJob *)local_60,free_subscribe_arg);
        TPJobSetPriority((ThreadPoolJob *)local_60,MED_PRIORITY);
        job.jobId = TimerThreadSchedule(&gTimerThread,(long)(TimeOut + -10),REL_SEC,
                                        (ThreadPoolJob *)local_60,SHORT_TERM,__s + 1);
        if (job.jobId == 0) {
          GenlibClientSubscription_set_RenewEventId(sub,__s[1]);
          job.jobId = 0;
        }
        else {
          free_subscribe_arg(__s);
        }
      }
    }
  }
  return job.jobId;
}

Assistant:

static int ScheduleGenaAutoRenew(
	/*! [in] Handle that also contains the subscription list. */
	int client_handle,
	/*! [in] The time out value of the subscription. */
	int TimeOut,
	/*! [in] Subscription being renewed. */
	GenlibClientSubscription *sub)
{
	UpnpEventSubscribe *RenewEvent = NULL;
	job_arg *arg = NULL;
	int return_code = GENA_SUCCESS;
	ThreadPoolJob job;

	memset(&job, 0, sizeof(job));

	if (TimeOut == UPNP_INFINITE) {
		return_code = GENA_SUCCESS;
		goto end_function;
	}

	RenewEvent = UpnpEventSubscribe_new();
	if (RenewEvent == NULL) {
		return_code = UPNP_E_OUTOF_MEMORY;
		goto end_function;
	}

	arg = (job_arg *)malloc(sizeof(job_arg));
	if (arg == NULL) {
		free(RenewEvent);
		return_code = UPNP_E_OUTOF_MEMORY;
		goto end_function;
	}
	memset(arg, 0, sizeof(job_arg));

	/* schedule expire event */
	UpnpEventSubscribe_set_ErrCode(RenewEvent, UPNP_E_SUCCESS);
	UpnpEventSubscribe_set_TimeOut(RenewEvent, TimeOut);
	UpnpEventSubscribe_set_SID(
		RenewEvent, GenlibClientSubscription_get_SID(sub));
	UpnpEventSubscribe_set_PublisherUrl(
		RenewEvent, GenlibClientSubscription_get_EventURL(sub));

	arg->handle = client_handle;
	arg->Event = RenewEvent;

	TPJobInit(&job, (start_routine)GenaAutoRenewSubscription, arg);
	TPJobSetFreeFunction(&job, (free_routine)free_subscribe_arg);
	TPJobSetPriority(&job, MED_PRIORITY);

	/* Schedule the job */
	return_code = TimerThreadSchedule(&gTimerThread,
		TimeOut - AUTO_RENEW_TIME,
		REL_SEC,
		&job,
		SHORT_TERM,
		&(arg->eventId));
	if (return_code != UPNP_E_SUCCESS) {
		free_subscribe_arg(arg);
		goto end_function;
	}

	GenlibClientSubscription_set_RenewEventId(sub, arg->eventId);

	return_code = GENA_SUCCESS;

end_function:

	return return_code;
}